

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlacon2.c
# Opt level: O2

int dlacon2_(int *n,double *v,double *x,int *isgn,double *est,int *kase,int *isave)

{
  double *pdVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  integer iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  doublereal dVar10;
  double dVar11;
  int c__1;
  double local_48;
  
  c__1 = 1;
  if (*kase == 0) {
    uVar7 = *n;
    uVar8 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar8;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      x[uVar8] = 1.0 / (double)(int)uVar7;
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar5 = idamax_(n,x,&c__1);
    iVar4 = iVar5 + -1;
    isave[1] = iVar4;
    isave[2] = 2;
    goto LAB_0010e7ea;
  case 3:
    dcopy_(n,x,&c__1,v,&c__1);
    local_48 = *est;
    dVar10 = dasum_(n,v,&c__1);
    *est = dVar10;
    uVar7 = *n;
    uVar9 = 0;
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
    }
    do {
      if (uVar8 == uVar9) goto LAB_0010e943;
      pdVar1 = x + uVar9;
      piVar2 = isgn + uVar9;
      uVar9 = uVar9 + 1;
    } while ((*(double *)(&DAT_00112b20 + (ulong)(*pdVar1 < 0.0) * 8) == (double)*piVar2) &&
            (!NAN(*(double *)(&DAT_00112b20 + (ulong)(*pdVar1 < 0.0) * 8)) && !NAN((double)*piVar2))
            );
    if (local_48 < dVar10) {
      for (lVar6 = 0; lVar6 < (int)uVar7; lVar6 = lVar6 + 1) {
        dVar11 = x[lVar6];
        x[lVar6] = *(double *)(&DAT_00112b20 + (ulong)(dVar11 < 0.0) * 8);
        isgn[lVar6] = -(uint)(dVar11 < 0.0) | 1;
        uVar7 = *n;
      }
      *kase = 2;
      *isave = 4;
      return 0;
    }
LAB_0010e943:
    uVar7 = *n;
    uVar8 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar8;
    }
    iVar4 = 1;
    dVar11 = 1.0;
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      x[uVar8] = ((double)(iVar4 + -1) / (double)(int)(uVar7 - 1) + 1.0) * dVar11;
      dVar11 = -dVar11;
      iVar4 = iVar4 + 1;
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar3 = isave[1];
    iVar5 = idamax_(n,x,&c__1);
    iVar4 = iVar5 + -1;
    isave[1] = iVar4;
    if (((x[iVar3] == ABS(x[(long)iVar5 + -1])) &&
        (!NAN(x[iVar3]) && !NAN(ABS(x[(long)iVar5 + -1])))) || (4 < isave[2])) goto LAB_0010e943;
    isave[2] = isave[2] + 1;
LAB_0010e7ea:
    uVar8 = 0;
    uVar9 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar9 = uVar8;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      x[uVar8] = 0.0;
    }
    x[iVar4] = 1.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 5:
    dVar10 = dasum_(n,x,&c__1);
    local_48 = dVar10 / (double)(*n * 3);
    local_48 = local_48 + local_48;
    if (local_48 < *est || local_48 == *est) goto LAB_0010e9c5;
    dcopy_(n,x,&c__1,v,&c__1);
    break;
  default:
    if (*n != 1) {
      dVar10 = dasum_(n,x,&c__1);
      *est = dVar10;
      for (lVar6 = 0; lVar6 < *n; lVar6 = lVar6 + 1) {
        dVar11 = x[lVar6];
        x[lVar6] = *(double *)(&DAT_00112b20 + (ulong)(dVar11 < 0.0) * 8);
        isgn[lVar6] = -(uint)(dVar11 < 0.0) | 1;
      }
      *kase = 2;
      *isave = 2;
      return 0;
    }
    local_48 = *x;
    *v = local_48;
    local_48 = ABS(local_48);
  }
  *est = local_48;
LAB_0010e9c5:
  *kase = 0;
  return 0;
}

Assistant:

int
dlacon2_(int *n, double *v, double *x, int *isgn, double *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    double      zero = 0.0;
    double      one = 1.0;
    
    /* Local variables */
    int jlast;
    double altsgn, estold;
    int i;
    double temp;
#ifdef _CRAY
    extern int ISAMAX(int *, double *, int *);
    extern double SASUM(int *, double *, int *);
    extern int SCOPY(int *, double *, int *, double *, int *);
#else
    extern int idamax_(int *, double *, int *);
    extern double dasum_(int *, double *, int *);
    extern void dcopy_(int *, double *, int *, double *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (double) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = dasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    dcopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = dasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((double)(i - 1) / (double)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (double)(*n * 3) * 2.;
#else
    temp = dasum_(n, x, &c__1) / (double)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	dcopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}